

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.cpp
# Opt level: O0

void __thiscall
SQCompilation::SwitchStatement::visitChildren(SwitchStatement *this,Visitor *visitor)

{
  ArenaVector<SQCompilation::SwitchCase> *this_00;
  Node *this_01;
  Node *visitor_00;
  SwitchStatement *in_RDI;
  SwitchCase *c;
  iterator __end1;
  iterator __begin1;
  ArenaVector<SQCompilation::SwitchCase> *__range1;
  Visitor *in_stack_ffffffffffffffd8;
  Node *in_stack_ffffffffffffffe0;
  
  Node::visit<SQCompilation::Visitor>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = cases(in_RDI);
  this_01 = (Node *)ArenaVector<SQCompilation::SwitchCase>::begin(this_00);
  visitor_00 = (Node *)ArenaVector<SQCompilation::SwitchCase>::end(this_00);
  for (; this_01 != visitor_00; this_01 = (Node *)&(this_01->_coordinates).lineEnd) {
    Node::visit<SQCompilation::Visitor>(this_01,(Visitor *)visitor_00);
    Node::visit<SQCompilation::Visitor>(this_01,(Visitor *)visitor_00);
  }
  if ((in_RDI->_defaultCase).stmt != (Statement *)0x0) {
    Node::visit<SQCompilation::Visitor>(this_01,(Visitor *)visitor_00);
  }
  return;
}

Assistant:

void SwitchStatement::visitChildren(Visitor *visitor) {
    _expr->visit(visitor);

    for (auto &c : cases()) {
        c.val->visit(visitor);
        c.stmt->visit(visitor);
    }

    if (_defaultCase.stmt) {
        _defaultCase.stmt->visit(visitor);
    }
}